

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_symbolic.c
# Opt level: O3

lu_int lu_solve_symbolic(lu_int m,lu_int *begin,lu_int *end,lu_int *index,lu_int nrhs,lu_int *irhs,
                        lu_int *ilhs,lu_int *pstack,lu_int *marked,lu_int M)

{
  ulong uVar1;
  
  if (0 < nrhs) {
    uVar1 = 0;
    do {
      if (marked[irhs[uVar1]] != M) {
        m = lu_dfs(irhs[uVar1],begin,end,index,m,ilhs,pstack,marked,M);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nrhs != uVar1);
  }
  return m;
}

Assistant:

lu_int lu_solve_symbolic
(
    const lu_int m,
    const lu_int *begin,
    const lu_int *end,
    const lu_int *index,
    const lu_int nrhs,
    const lu_int *irhs,
    lu_int *ilhs,
    lu_int *pstack,             /* size m workspace */
    lu_int *marked,             /* marked[i] != M on entry */
    const lu_int M
)
{
    lu_int i, n, top = m;

    for (n = 0; n < nrhs; n++)
        if (marked[i = irhs[n]] != M)
            top = lu_dfs(i, begin, end, index, top, ilhs, pstack, marked, M);

    return top;
}